

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_float_vector(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_attr_chlist_t *peVar1;
  int iVar2;
  void *__dest;
  long lVar3;
  int32_t isz;
  
  if (((long)(((a->field_6).box2i)->min).x & 0x3fffffffe0000000U) == 0) {
    iVar2 = (*ctxt->do_write)(ctxt,&stack0xffffffffffffffdc,4,&ctxt->output_file_offset);
  }
  else {
    iVar2 = (*ctxt->standard_error)(ctxt,3);
  }
  if (iVar2 == 0) {
    peVar1 = (a->field_6).chlist;
    lVar3 = (long)peVar1->num_channels;
    if (lVar3 < 1) {
      iVar2 = 0;
    }
    else if (peVar1->num_alloced < 1) {
      __dest = (*ctxt->alloc_fn)(lVar3 << 2);
      if (__dest == (void *)0x0) {
        iVar2 = (*ctxt->standard_error)(ctxt,1);
      }
      else {
        memcpy(__dest,((a->field_6).chlist)->entries,(long)((a->field_6).chlist)->num_channels << 2)
        ;
        iVar2 = (*ctxt->do_write)(ctxt,__dest,(long)(((a->field_6).box2i)->min).x << 2,
                                  &ctxt->output_file_offset);
        (*ctxt->free_fn)(__dest);
      }
    }
    else {
      iVar2 = (*ctxt->do_write)(ctxt,peVar1->entries,lVar3 << 2,&ctxt->output_file_offset);
    }
  }
  return iVar2;
}

Assistant:

static exr_result_t
save_float_vector (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;

    rv =
        save_attr_sz (ctxt, sizeof (float) * (size_t) (a->floatvector->length));
    if (rv == EXR_ERR_SUCCESS && a->floatvector->length > 0)
    {
        if (a->floatvector->alloc_size > 0)
        {
            /* we own the data, so we can swap it, then swap it back */
            rv = save_attr_32 (
                ctxt,
                EXR_CONST_CAST (void*, a->floatvector->arr),
                a->floatvector->length);
            priv_to_native32 (
                EXR_CONST_CAST (void*, a->floatvector->arr),
                a->floatvector->length);
        }
        else
        {
            /* might be static data, take a copy first */
            float* tmp = ctxt->alloc_fn (
                (size_t) (a->floatvector->length) * sizeof (float));
            if (tmp == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
            memcpy (
                tmp,
                a->floatvector->arr,
                (size_t) (a->floatvector->length) * sizeof (float));
            rv = save_attr_32 (ctxt, tmp, a->floatvector->length);
            ctxt->free_fn (tmp);
        }
    }

    return rv;
}